

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O0

int run_test_process_title_threadsafe(void)

{
  int iVar1;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_60 [4];
  int i;
  uv_sem_t getter_sem;
  uv_thread_t getter_thread;
  uv_thread_t setter_threads [4];
  
  iVar1 = uv_set_process_title(titles[0]);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
            ,0x5c,"uv_set_process_title(titles[0])","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_sem_init((uv_sem_t *)local_60,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
            ,0x5e,"uv_sem_init(&getter_sem, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_create((uv_thread_t *)(getter_sem.__size + 0x18),getter_thread_body,local_60);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
            ,0x5f,"uv_thread_create(&getter_thread, getter_thread_body, &getter_sem)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  eval_a._4_4_ = 0;
  while( true ) {
    if (3 < eval_a._4_4_) {
      eval_a._4_4_ = 0;
      while( true ) {
        if (3 < eval_a._4_4_) {
          uv_sem_post((uv_sem_t *)local_60);
          iVar1 = uv_thread_join((uv_thread_t *)(getter_sem.__size + 0x18));
          if ((long)iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
                    ,0x68,"uv_thread_join(&getter_thread)","==","0",(long)iVar1,"==",0);
            abort();
          }
          uv_sem_destroy((uv_sem_t *)local_60);
          return 0;
        }
        iVar1 = uv_thread_join(setter_threads + (long)eval_a._4_4_ + -1);
        if ((long)iVar1 != 0) break;
        eval_a._4_4_ = eval_a._4_4_ + 1;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
              ,0x65,"uv_thread_join(&setter_threads[i])","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_thread_create(setter_threads + (long)eval_a._4_4_ + -1,setter_thread_body,(void *)0x0
                            );
    if ((long)iVar1 != 0) break;
    eval_a._4_4_ = eval_a._4_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
          ,0x62,"uv_thread_create(&setter_threads[i], setter_thread_body, ((void*)0))","==","0",
          (long)iVar1,"==",0);
  abort();
}

Assistant:

TEST_IMPL(process_title_threadsafe) {
  uv_thread_t setter_threads[4];
  uv_thread_t getter_thread;
  uv_sem_t getter_sem;
  int i;

#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__MVS__) || defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  ASSERT_OK(uv_set_process_title(titles[0]));

  ASSERT_OK(uv_sem_init(&getter_sem, 0));
  ASSERT_OK(uv_thread_create(&getter_thread, getter_thread_body, &getter_sem));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT_OK(uv_thread_create(&setter_threads[i], setter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT_OK(uv_thread_join(&setter_threads[i]));

  uv_sem_post(&getter_sem);
  ASSERT_OK(uv_thread_join(&getter_thread));
  uv_sem_destroy(&getter_sem);

  return 0;
}